

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O3

void __thiscall FGameConfigFile::DoGlobalSetup(FGameConfigFile *this)

{
  UCVarValue value;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *__nptr;
  FBaseCVar *pFVar6;
  size_t sVar7;
  uint uVar8;
  UCVarValue value_00;
  UCVarValue value_01;
  UCVarValue value_02;
  double dVar9;
  undefined4 uStack_2c;
  
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"GlobalSettings.Unknown",false);
  if (bVar1) {
    ReadCVars(this,0x400);
  }
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"GlobalSettings",false);
  if (bVar1) {
    ReadCVars(this,0x400);
    pcVar5 = FConfigFile::GetValueForKey(&this->super_FConfigFile,"gl_texture_hqresize");
    __nptr = FConfigFile::GetValueForKey(&this->super_FConfigFile,"gl_texture_hqresize_targets");
    if (__nptr != (char *)0x0 && pcVar5 != (char *)0x0) {
      uVar2 = atoi(pcVar5);
      uVar3 = atoi(__nptr);
      if (uVar3 != 0 && uVar2 != 0) {
        uVar8 = uVar2 + 3;
        if ((int)uVar2 < 7) {
          uVar8 = uVar2;
        }
        value_00._0_4_ = -(uVar3 & 1) & uVar8;
        value_00._4_4_ = 0;
        FBaseCVar::SetGenericRep(&gl_texture_hqresize_textures.super_FBaseCVar,value_00,CVAR_Int);
        value_01._0_4_ = (int)(uVar3 << 0x1e) >> 0x1f & uVar8;
        value_01._4_4_ = 0;
        FBaseCVar::SetGenericRep(&gl_texture_hqresize_sprites.super_FBaseCVar,value_01,CVAR_Int);
        value_02._0_4_ = (int)(uVar3 << 0x1d) >> 0x1f & uVar8;
        value_02._4_4_ = 0;
        FBaseCVar::SetGenericRep(&gl_texture_hqresize_fonts.super_FBaseCVar,value_02,CVAR_Int);
      }
      FConfigFile::ClearKey(&this->super_FConfigFile,"gl_texture_hqresize");
      FConfigFile::ClearKey(&this->super_FConfigFile,"gl_texture_hqresize_targets");
    }
  }
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"LastRun",false);
  if ((bVar1) &&
     (pcVar5 = FConfigFile::GetValueForKey(&this->super_FConfigFile,"Version"),
     pcVar5 != (char *)0x0)) {
    dVar9 = atof(pcVar5);
    if ((dVar9 < 123.1) &&
       (pFVar6 = FindCVar("vid_noblitter",(FBaseCVar **)0x0), pFVar6 != (FBaseCVar *)0x0)) {
      FBaseCVar::ResetToDefault(pFVar6);
    }
    if ((dVar9 < 202.0) &&
       (bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"Hexen.Bindings",false), bVar1)) {
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"\\","use ArtiHealth",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"scroll","+showscores",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"0","useflechette",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"9","use ArtiBlastRadius",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"8","use ArtiTeleport",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"7","use ArtiTeleportOther",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"6","use ArtiPork",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"5","use ArtiInvulnerability2",false);
    }
    if ((dVar9 < 204.0) &&
       (pFVar6 = FindCVar("vid_vsync",(FBaseCVar **)0x0), pFVar6 != (FBaseCVar *)0x0)) {
      FBaseCVar::ResetToDefault(pFVar6);
    }
    if ((dVar9 < 206.0) && (16.0 < spc_amp.Value)) {
      value._4_4_ = uStack_2c;
      value.Float = spc_amp.Value * 0.0625;
      FBaseCVar::SetGenericRep(&spc_amp.super_FBaseCVar,value,CVAR_Float);
    }
    if ((dVar9 < 207.0) &&
       (pFVar6 = FindCVar("snd_midiprecache",(FBaseCVar **)0x0), pFVar6 != (FBaseCVar *)0x0)) {
      FBaseCVar::ResetToDefault(pFVar6);
    }
    if ((dVar9 < 208.0) && (bVar1 = FConfigFile::SetFirstSection(&this->super_FConfigFile), bVar1))
    {
      do {
        pcVar5 = FConfigFile::GetCurrentSection(&this->super_FConfigFile);
        if ((pcVar5 == (char *)0x0) ||
           ((sVar7 = strlen(pcVar5), sVar7 < 0xd ||
            (iVar4 = strcmp(pcVar5 + (sVar7 - 0xc),".WeaponSlots"), iVar4 != 0)))) {
          bVar1 = FConfigFile::SetNextSection(&this->super_FConfigFile);
        }
        else {
          bVar1 = FConfigFile::DeleteCurrentSection(&this->super_FConfigFile);
        }
      } while (bVar1 != false);
    }
    if ((dVar9 < 209.0) &&
       (pFVar6 = FindCVar("dimamount",(FBaseCVar **)0x0), pFVar6 != (FBaseCVar *)0x0)) {
      FBaseCVar::ResetToDefault(pFVar6);
    }
    if ((dVar9 < 210.0) &&
       (bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,"Hexen.Bindings",false), bVar1)) {
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"6","use ArtiPork",false);
      FConfigFile::SetValueForKey(&this->super_FConfigFile,"5","use ArtiInvulnerability2",false);
      return;
    }
  }
  return;
}

Assistant:

void FGameConfigFile::DoGlobalSetup ()
{
	if (SetSection ("GlobalSettings.Unknown"))
	{
		ReadCVars (CVAR_GLOBALCONFIG);
	}
	if (SetSection ("GlobalSettings"))
	{
		ReadCVars (CVAR_GLOBALCONFIG);

		ConvertHQResizeMode(*this);
	}
	if (SetSection ("LastRun"))
	{
		const char *lastver = GetValueForKey ("Version");
		if (lastver != NULL)
		{
			double last = atof (lastver);
			if (last < 123.1)
			{
				FBaseCVar *noblitter = FindCVar ("vid_noblitter", NULL);
				if (noblitter != NULL)
				{
					noblitter->ResetToDefault ();
				}
			}
			if (last < 202)
			{
				// Make sure the Hexen hotkeys are accessible by default.
				if (SetSection ("Hexen.Bindings"))
				{
					SetValueForKey ("\\", "use ArtiHealth");
					SetValueForKey ("scroll", "+showscores");
					SetValueForKey ("0", "useflechette");
					SetValueForKey ("9", "use ArtiBlastRadius");
					SetValueForKey ("8", "use ArtiTeleport");
					SetValueForKey ("7", "use ArtiTeleportOther");
					SetValueForKey ("6", "use ArtiPork");
					SetValueForKey ("5", "use ArtiInvulnerability2");
				}
			}
			if (last < 204)
			{ // The old default for vsync was true, but with an unlimited framerate
			  // now, false is a better default.
				FBaseCVar *vsync = FindCVar ("vid_vsync", NULL);
				if (vsync != NULL)
				{
					vsync->ResetToDefault ();
				}
			}
			if (last < 206)
			{ // spc_amp is now a float, not an int.
				if (spc_amp > 16)
				{
					spc_amp = spc_amp / 16.f;
				}
			}
			if (last < 207)
			{ // Now that snd_midiprecache works again, you probably don't want it on.
				FBaseCVar *precache = FindCVar ("snd_midiprecache", NULL);
				if (precache != NULL)
				{
					precache->ResetToDefault();
				}
			}
			if (last < 208)
			{ // Weapon sections are no longer used, so tidy up the config by deleting them.
				const char *name;
				size_t namelen;
				bool more;

				more = SetFirstSection();
				while (more)
				{
					name = GetCurrentSection();
					if (name != NULL && 
						(namelen = strlen(name)) > 12 &&
						strcmp(name + namelen - 12, ".WeaponSlots") == 0)
					{
						more = DeleteCurrentSection();
					}
					else
					{
						more = SetNextSection();
					}
				}
			}
			if (last < 209)
			{
				// menu dimming is now a gameinfo option so switch user override off
				FBaseCVar *dim = FindCVar ("dimamount", NULL);
				if (dim != NULL)
				{
					dim->ResetToDefault ();
				}
			}
			if (last < 210)
			{
				if (SetSection ("Hexen.Bindings"))
				{
					// These 2 were misnamed in earlier versions
					SetValueForKey ("6", "use ArtiPork");
					SetValueForKey ("5", "use ArtiInvulnerability2");
				}
			}
		}
	}
}